

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

FIOBJ http_str2fiobj(char *s,size_t len,uint8_t encoded)

{
  int iVar1;
  FIOBJ FVar2;
  double num;
  double tmp_1;
  char *end_1;
  uint64_t tmp;
  char *end;
  size_t sStack_20;
  uint8_t encoded_local;
  size_t len_local;
  char *s_local;
  
  end._7_1_ = encoded;
  sStack_20 = len;
  len_local = (size_t)s;
  if (len == 0) {
    FVar2 = fiobj_str_new((char *)0x0,0);
    return FVar2;
  }
  if (len == 4) {
    iVar1 = strncasecmp(s,"true",4);
    if (iVar1 == 0) {
      FVar2 = fiobj_true();
      return FVar2;
    }
    iVar1 = strncasecmp((char *)len_local,"null",4);
    if (iVar1 == 0) {
      FVar2 = fiobj_null();
      return FVar2;
    }
  }
  else if ((len == 5) && (iVar1 = strncasecmp(s,"false",5), iVar1 == 0)) {
    FVar2 = fiobj_false();
    return FVar2;
  }
  tmp = len_local;
  end_1 = (char *)fio_atol((char **)&tmp);
  if (tmp == len_local + sStack_20) {
    s_local = (char *)fiobj_num_new((intptr_t)end_1);
  }
  else {
    tmp_1 = (double)len_local;
    num = fio_atof((char **)&tmp_1);
    if (tmp_1 == (double)(len_local + sStack_20)) {
      s_local = (char *)fiobj_float_new(num);
    }
    else if (end._7_1_ == '\0') {
      s_local = (char *)fiobj_str_new((char *)len_local,sStack_20);
    }
    else {
      s_local = (char *)http_urlstr2fiobj((char *)len_local,sStack_20);
    }
  }
  return (FIOBJ)s_local;
}

Assistant:

static inline FIOBJ http_str2fiobj(char *s, size_t len, uint8_t encoded) {
  switch (len) {
  case 0:
    return fiobj_str_new(NULL, 0); /* empty string */
  case 4:
    if (!strncasecmp(s, "true", 4))
      return fiobj_true();
    if (!strncasecmp(s, "null", 4))
      return fiobj_null();
    break;
  case 5:
    if (!strncasecmp(s, "false", 5))
      return fiobj_false();
  }
  {
    char *end = s;
    const uint64_t tmp = fio_atol(&end);
    if (end == s + len)
      return fiobj_num_new(tmp);
  }
  {
    char *end = s;
    const double tmp = fio_atof(&end);
    if (end == s + len)
      return fiobj_float_new(tmp);
  }
  if (encoded)
    return http_urlstr2fiobj(s, len);
  return fiobj_str_new(s, len);
}